

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O1

vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
* __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::matches(vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
          *__return_storage_ptr__,
         Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
         *this)

{
  unsigned_long *puVar1;
  pointer pVVar2;
  long lVar3;
  unsigned_long *puVar4;
  unsigned_long *row;
  unsigned_long *__args;
  unsigned_long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair,_std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>::IndexPair>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__args = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; __args != puVar1; __args = __args + 1) {
    pVVar2 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *__args * 0x40;
    for (puVar4 = *(unsigned_long **)&((Adjacencies *)((long)(pVVar2 + *__args) + 0x20))->vector_;
        puVar4 != *(unsigned_long **)((long)&pVVar2->to_ + lVar3 + 8U); puVar4 = puVar4 + 2) {
      if ((this->mask_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[puVar4[1]] == 1) {
        local_38 = *puVar4;
        std::
        vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
        ::emplace_back<unsigned_long_const&,unsigned_long>
                  ((vector<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair,std::allocator<markurem::matching::Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>>,std::vector<double,std::allocator<double>>,std::vector<int,std::allocator<int>>>::IndexPair>>
                    *)__return_storage_ptr__,__args,&local_38);
      }
      pVVar2 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = *__args << 6;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename Matching<GRAPH, COST, MASK>::IndexPair>
Matching<GRAPH, COST, MASK>::matches() const
{
    std::vector<IndexPair> matches;
    for (auto const& row : rows_) {
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it)
            if (mask_[it->edge()] == STARRED)
                matches.emplace_back(row, it->vertex());
    }
    return matches;
}